

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

int connecting_getsock(Curl_easy *data,curl_socket_t *socks)

{
  connectdata *pcVar1;
  connectdata *conn;
  curl_socket_t *socks_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  if ((pcVar1 == (connectdata *)0x0) || (pcVar1->sock[0] == -1)) {
    data_local._4_4_ = 0;
  }
  else {
    *socks = pcVar1->sock[0];
    data_local._4_4_ = 1;
  }
  return data_local._4_4_;
}

Assistant:

static int connecting_getsock(struct Curl_easy *data, curl_socket_t *socks)
{
  struct connectdata *conn = data->conn;
  (void)socks;
  /* Not using `conn->sockfd` as `Curl_setup_transfer()` initializes
   * that *after* the connect. */
  if(conn && conn->sock[FIRSTSOCKET] != CURL_SOCKET_BAD) {
    /* Default is to wait to something from the server */
    socks[0] = conn->sock[FIRSTSOCKET];
    return GETSOCK_READSOCK(0);
  }
  return GETSOCK_BLANK;
}